

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGatherCase::deinit(TextureGatherCase *this)

{
  UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> local_20;
  
  local_20.m_data.ptr = (ShaderProgram *)0x0;
  if ((this->m_program).
      super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.m_data.ptr !=
      (ShaderProgram *)0x0) {
    de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
              (&(this->m_program).
                super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>);
    (this->m_program).super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.
    m_data.ptr = (ShaderProgram *)0x0;
  }
  de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
            (&local_20);
  local_20.m_data.ptr = (ShaderProgram *)0x0;
  if ((this->m_fbo).
      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
      .m_data.ptr != (TypedObjectWrapper<(glu::ObjectType)3> *)0x0) {
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
    ::reset(&(this->m_fbo).
             super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
           );
    (this->m_fbo).
    super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
    .m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)3> *)0x0;
  }
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::reset((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
           *)&local_20);
  local_20.m_data.ptr = (ShaderProgram *)0x0;
  if ((this->m_colorBuffer).
      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
      .m_data.ptr != (TypedObjectWrapper<(glu::ObjectType)2> *)0x0) {
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
    ::reset(&(this->m_colorBuffer).
             super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
           );
    (this->m_colorBuffer).
    super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
    .m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)2> *)0x0;
  }
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  ::reset((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
           *)&local_20);
  return;
}

Assistant:

void TextureGatherCase::deinit (void)
{
	m_program		= MovePtr<ShaderProgram>(DE_NULL);
	m_fbo			= MovePtr<glu::Framebuffer>(DE_NULL);
	m_colorBuffer	= MovePtr<glu::Renderbuffer>(DE_NULL);
}